

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O0

int equal_trip(trip_t *a,trip_t *b)

{
  int iVar1;
  bool local_19;
  trip_t *b_local;
  trip_t *a_local;
  
  iVar1 = strcmp(a->route_id,b->route_id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->service_id,b->service_id);
    local_19 = false;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->id,b->id);
      local_19 = false;
      if (iVar1 == 0) {
        iVar1 = strcmp(a->headsign,b->headsign);
        local_19 = false;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->short_name,b->short_name);
          local_19 = false;
          if (iVar1 == 0) {
            iVar1 = strcmp(a->block_id,b->block_id);
            local_19 = false;
            if (iVar1 == 0) {
              iVar1 = strcmp(a->shape_id,b->shape_id);
              local_19 = false;
              if (((iVar1 == 0) && (local_19 = false, a->direction_id == b->direction_id)) &&
                 (local_19 = false, a->wheelchair_accessible == b->wheelchair_accessible)) {
                local_19 = a->bikes_allowed == b->bikes_allowed;
              }
            }
          }
        }
      }
    }
  }
  return (int)local_19;
}

Assistant:

int equal_trip(const trip_t *a, const trip_t *b) {
    return (!strcmp(a->route_id, b->route_id) &&
             !strcmp(a->service_id, b->service_id) &&
             !strcmp(a->id, b->id) &&
             !strcmp(a->headsign, b->headsign) &&
             !strcmp(a->short_name, b->short_name) &&
             !strcmp(a->block_id, b->block_id) &&
             !strcmp(a->shape_id, b->shape_id) &&
             a->direction_id == b->direction_id &&
             a->wheelchair_accessible == b->wheelchair_accessible &&
             a->bikes_allowed == b->bikes_allowed);
}